

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O1

void __thiscall
wasm::ReconstructStringifyWalker::addUniqueSymbol
          (ReconstructStringifyWalker *this,SeparatorReason reason)

{
  char in_DL;
  Function *in_RSI;
  Fatal local_1d8;
  undefined1 local_50 [8];
  Result<wasm::Ok> _val;
  
  if (in_DL == '\0') {
    startExistingFunction(this,in_RSI);
    return;
  }
  this->instrCounter = this->instrCounter + 1;
  switch(in_DL) {
  case '\x01':
    IRBuilder::visitBlockStart
              ((Result<wasm::Ok> *)local_50,&this->existingBuilder,(Block *)in_RSI,(Type)0x0);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
LAB_008b855c:
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_50);
      return;
    }
    Fatal::Fatal(&local_1d8);
    Fatal::operator<<(&local_1d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50)
    ;
    break;
  case '\x02':
    IRBuilder::push(&this->existingBuilder,
                    *(Expression **)&(in_RSI->super_Importable).super_Named.hasExplicitName);
    IRBuilder::visitIfStart
              ((Result<wasm::Ok> *)local_50,&this->existingBuilder,(If *)in_RSI,(Name)ZEXT816(0),
               (Type)0x0);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') goto LAB_008b855c;
    Fatal::Fatal(&local_1d8);
    Fatal::operator<<(&local_1d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50)
    ;
    break;
  case '\x03':
    IRBuilder::visitElse((Result<wasm::Ok> *)local_50,&this->existingBuilder);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') goto LAB_008b855c;
    Fatal::Fatal(&local_1d8);
    Fatal::operator<<(&local_1d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50)
    ;
    break;
  case '\x04':
    IRBuilder::visitLoopStart
              ((Result<wasm::Ok> *)local_50,&this->existingBuilder,(Loop *)in_RSI,(Type)0x0);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') goto LAB_008b855c;
    Fatal::Fatal(&local_1d8);
    Fatal::operator<<(&local_1d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50)
    ;
    break;
  default:
    handle_unreachable("unimplemented control flow",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Outlining.cpp"
                       ,0x9c);
  case '\a':
    IRBuilder::visitEnd((Result<wasm::Ok> *)local_50,&this->existingBuilder);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      Fatal::Fatal(&local_1d8);
      Fatal::operator<<(&local_1d8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_50);
      (this->existingBuilder).func = this->func;
      IRBuilder::build((Result<wasm::Expression_*> *)local_50,&this->existingBuilder);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
        std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Expression_*,_wasm::Err> *)local_50);
        return;
      }
      Fatal::Fatal(&local_1d8);
      Fatal::operator<<(&local_1d8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
    }
  }
  Fatal::~Fatal(&local_1d8);
}

Assistant:

void addUniqueSymbol(SeparatorReason reason) {
    if (auto curr = reason.getFuncStart()) {
      startExistingFunction(curr->func);
      return;
    }

    // instrCounter is managed manually and incremented at the beginning of
    // addUniqueSymbol() and visitExpression(), except for the case where we are
    // starting a new function, as that resets the counters back to 0.
    instrCounter++;

    ODBG(std::string desc);
    if (auto curr = reason.getBlockStart()) {
      ODBG(desc = "Block Start at ");
      ASSERT_OK(existingBuilder.visitBlockStart(curr->block));
    } else if (auto curr = reason.getIfStart()) {
      // IR builder needs the condition of the If pushed onto the builder before
      // visitIfStart(), which will expect to be able to pop the condition.
      // This is always okay to do because the correct condition was installed
      // onto the If when the outer scope was visited.
      existingBuilder.push(curr->iff->condition);
      ODBG(desc = "If Start at ");
      ASSERT_OK(existingBuilder.visitIfStart(curr->iff));
    } else if (reason.getElseStart()) {
      ODBG(desc = "Else Start at ");
      ASSERT_OK(existingBuilder.visitElse());
    } else if (auto curr = reason.getLoopStart()) {
      ODBG(desc = "Loop Start at ");
      ASSERT_OK(existingBuilder.visitLoopStart(curr->loop));
    } else if (reason.getEnd()) {
      ODBG(desc = "End at ");
      ASSERT_OK(existingBuilder.visitEnd());
      // Reset the function in case we just ended the function scope.
      existingBuilder.setFunction(func);
      // Outlining performs an unnested walk of the Wasm module, visiting
      // each scope one at a time. IRBuilder, in contrast, expects to
      // visit several nested scopes at a time. Thus, calling end() finalizes
      // the control flow and places it on IRBuilder's internal stack, ready for
      // the enclosing scope to consume its expressions off the stack. Since
      // outlining walks unnested, the enclosing scope never arrives to retrieve
      // its expressions off the stack, so we must call build() after visitEnd()
      // to clear the internal stack IRBuilder manages.
      ASSERT_OK(existingBuilder.build());
    } else {
      ODBG(desc = "addUniqueSymbol for unimplemented control flow ");
      WASM_UNREACHABLE("unimplemented control flow");
    }
    ODBG(printAddUniqueSymbol(desc));
  }